

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LazyJSONString.cpp
# Opt level: O2

bool __thiscall Js::LazyJSONString::HasComplexGap(LazyJSONString *this)

{
  ulong uVar1;
  charcount_t i;
  ulong uVar2;
  ulong uVar3;
  
  uVar1 = (ulong)*(uint *)&(this->super_JavascriptString).field_0x1c;
  uVar2 = 0;
  while (((uVar1 != uVar2 && (uVar3 = (ulong)(ushort)(this->gap).ptr[uVar2], uVar3 < 0x21)) &&
         ((0x100000600U >> (uVar3 & 0x3f) & 1) != 0))) {
    uVar2 = uVar2 + 1;
  }
  return uVar2 < uVar1;
}

Assistant:

bool
LazyJSONString::HasComplexGap() const
{
    for (charcount_t i = 0; i < this->gapLength; ++i)
    {
        switch (this->gap[i])
        {
        // This is not exhaustive, just a useful subset of semantics preserving characters
        case _u(' '):
        case _u('\t'):
        case _u('\n'):
            continue;
        default:
            return true;
        }
    }
    return false;
}